

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURL_conflict ** curl_multi_get_handles(Curl_multi *multi)

{
  CURL_conflict *pCVar1;
  ulong uVar2;
  CURL_conflict **ppCVar3;
  ulong uVar4;
  
  ppCVar3 = (CURL_conflict **)(*Curl_cmalloc)((ulong)(multi->num_easy + 1) << 3);
  if (ppCVar3 != (CURL_conflict **)0x0) {
    uVar2 = 0;
    for (pCVar1 = multi->easyp; pCVar1 != (CURL_conflict *)0x0; pCVar1 = pCVar1->next) {
      uVar4 = uVar2;
      if (((pCVar1->state).field_0x74e & 0x20) == 0) {
        uVar4 = (ulong)((int)uVar2 + 1);
        ppCVar3[uVar2] = pCVar1;
      }
      uVar2 = uVar4;
    }
    ppCVar3[uVar2] = (CURL_conflict *)0x0;
  }
  return ppCVar3;
}

Assistant:

struct Curl_easy **curl_multi_get_handles(struct Curl_multi *multi)
{
  struct Curl_easy **a = malloc(sizeof(struct Curl_easy *) *
                                (multi->num_easy + 1));
  if(a) {
    unsigned int i = 0;
    struct Curl_easy *e = multi->easyp;
    while(e) {
      DEBUGASSERT(i < multi->num_easy);
      if(!e->state.internal)
        a[i++] = e;
      e = e->next;
    }
    a[i] = NULL; /* last entry is a NULL */
  }
  return a;
}